

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPointAccelerationError
          (ContactConstraint *this,
          vector<Vector3_t,_std::allocator<Vector3_t>_> *pointAccelerationsSys,VectorNd *ddErrSysUpd
          )

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  Scalar *pSVar1;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *in_RSI;
  long in_RDI;
  uint i;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x30); local_1c = local_1c + 1) {
    other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                      ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0xd8),
                       (ulong)local_1c);
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              (in_RSI,(ulong)(*(int *)(in_RDI + 0x34) + local_1c));
    in_stack_ffffffffffffffd0 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
         Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                   ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffffd0,
                    other);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_ffffffffffffffd0,(Index)other);
    *pSVar1 = (Scalar)in_stack_ffffffffffffffd0;
  }
  return;
}

Assistant:

void ContactConstraint::
      calcPointAccelerationError(
                    const std::vector<Math::Vector3d> &pointAccelerationsSys,
                    Math::VectorNd &ddErrSysUpd)
{
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    ddErrSysUpd[rowInSystem+i] =
        T[i].dot(pointAccelerationsSys[rowInSystem+i]);
  }
}